

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontAtlas::GetTexDataAsAlpha8
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  uchar *puVar1;
  
  puVar1 = this->TexPixelsAlpha8;
  if (puVar1 == (uchar *)0x0) {
    Build(this);
    puVar1 = this->TexPixelsAlpha8;
  }
  *out_pixels = puVar1;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 1;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsAlpha8(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Build atlas on demand
    if (TexPixelsAlpha8 == NULL)
        Build();

    *out_pixels = TexPixelsAlpha8;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 1;
}